

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

void Gia_VtaDumpAbsracted(Vta_Man_t *p,int fVerbose)

{
  char *pcVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *pInit;
  char *pFileName;
  
  pcVar1 = p->pPars->pFileVabs;
  pFileName = "vabs.aig";
  if (pcVar1 != (char *)0x0) {
    pFileName = pcVar1;
  }
  if (fVerbose != 0) {
    Abc_Print((int)p,"Dumping abstracted model into file \"%s\"...\n",pFileName);
  }
  pGVar2 = p->pGia;
  if (pGVar2->vObjClasses != (Vec_Int_t *)0x0) {
    piVar3 = pGVar2->vObjClasses->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pGVar2->vObjClasses->pArray = (int *)0x0;
    }
    if (pGVar2->vObjClasses != (Vec_Int_t *)0x0) {
      free(pGVar2->vObjClasses);
      pGVar2->vObjClasses = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = Gia_VtaFramesToAbs((Vec_Vec_t *)p->vCores);
  pGVar2 = p->pGia;
  pGVar2->vObjClasses = pVVar4;
  if (pGVar2->vGateClasses != (Vec_Int_t *)0x0) {
    piVar3 = pGVar2->vGateClasses->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pGVar2->vGateClasses->pArray = (int *)0x0;
    }
    if (pGVar2->vGateClasses != (Vec_Int_t *)0x0) {
      free(pGVar2->vGateClasses);
      pGVar2->vGateClasses = (Vec_Int_t *)0x0;
    }
  }
  pVVar4 = Gia_VtaConvertToGla(p->pGia,p->pGia->vObjClasses);
  pGVar2 = p->pGia;
  pGVar2->vGateClasses = pVVar4;
  if (pGVar2->vObjClasses != (Vec_Int_t *)0x0) {
    piVar3 = pGVar2->vObjClasses->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pGVar2->vObjClasses->pArray = (int *)0x0;
    }
    if (pGVar2->vObjClasses != (Vec_Int_t *)0x0) {
      free(pGVar2->vObjClasses);
      pGVar2->vObjClasses = (Vec_Int_t *)0x0;
    }
  }
  pInit = Gia_ManDupAbsGates(p->pGia,p->pGia->vGateClasses);
  pGVar2 = p->pGia;
  if (pGVar2->vGateClasses != (Vec_Int_t *)0x0) {
    piVar3 = pGVar2->vGateClasses->pArray;
    if (piVar3 != (int *)0x0) {
      free(piVar3);
      pGVar2->vGateClasses->pArray = (int *)0x0;
    }
    if (pGVar2->vGateClasses != (Vec_Int_t *)0x0) {
      free(pGVar2->vGateClasses);
      pGVar2->vGateClasses = (Vec_Int_t *)0x0;
    }
  }
  Gia_AigerWrite(pInit,pFileName,0,0);
  Gia_ManStop(pInit);
  return;
}

Assistant:

void Gia_VtaDumpAbsracted( Vta_Man_t * p, int fVerbose )
{
    char * pFileNameDef = "vabs.aig";
    char * pFileName = p->pPars->pFileVabs ? p->pPars->pFileVabs : pFileNameDef;
    Gia_Man_t * pAbs;
    if ( fVerbose )
        Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
    // create obj classes
    Vec_IntFreeP( &p->pGia->vObjClasses );
    p->pGia->vObjClasses = Gia_VtaFramesToAbs( (Vec_Vec_t *)p->vCores );
    // create gate classes
    Vec_IntFreeP( &p->pGia->vGateClasses );
    p->pGia->vGateClasses = Gia_VtaConvertToGla( p->pGia, p->pGia->vObjClasses );
    Vec_IntFreeP( &p->pGia->vObjClasses );
    // create abstrated model
    pAbs = Gia_ManDupAbsGates( p->pGia, p->pGia->vGateClasses );
    Vec_IntFreeP( &p->pGia->vGateClasses );
    // send it out
    Gia_AigerWrite( pAbs, pFileName, 0, 0 );
    Gia_ManStop( pAbs );
}